

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEExecOptions.h
# Opt level: O0

void __thiscall CEExecOptions::AddIcrsPars(CEExecOptions *this)

{
  double in_RDI;
  string *psVar1;
  string *in_stack_ffffffffffffff48;
  CLOptions *in_stack_ffffffffffffff50;
  allocator local_89;
  string local_88 [39];
  allocator local_61;
  string local_60 [55];
  undefined1 local_29 [41];
  
  psVar1 = (string *)local_29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_29 + 1),"R,ra",(allocator *)psVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"RA in ICRS coordinate frame (degrees)",&local_61);
  CLOptions::AddDoubleParam(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,psVar1,in_RDI);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::__cxx11::string::~string((string *)(local_29 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"D,dec",&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff50,"DEC in the ICRS coordinate frame (degrees)",
             (allocator *)&stack0xffffffffffffff4f);
  CLOptions::AddDoubleParam(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,psVar1,in_RDI);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff4f);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  return;
}

Assistant:

inline
void CEExecOptions::AddIcrsPars(void)
{
    AddDoubleParam("R,ra", "RA in ICRS coordinate frame (degrees)", 0.0);
    AddDoubleParam("D,dec", "DEC in the ICRS coordinate frame (degrees)", 0.0);
}